

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_fill(nk_draw_list *list,nk_color color)

{
  nk_vec2 *points_00;
  nk_vec2 *points;
  nk_draw_list *list_local;
  nk_color color_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x2791,"void nk_draw_list_path_fill(struct nk_draw_list *, struct nk_color)");
  }
  if (list != (nk_draw_list *)0x0) {
    points_00 = (nk_vec2 *)nk_buffer_memory(list->buffer);
    nk_draw_list_fill_poly_convex(list,points_00,list->path_count,color,(list->config).shape_AA);
    nk_draw_list_path_clear(list);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_fill(struct nk_draw_list *list, struct nk_color color)
{
    struct nk_vec2 *points;
    NK_ASSERT(list);
    if (!list) return;
    points = (struct nk_vec2*)nk_buffer_memory(list->buffer);
    nk_draw_list_fill_poly_convex(list, points, list->path_count, color, list->config.shape_AA);
    nk_draw_list_path_clear(list);
}